

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUURI.cpp
# Opt level: O0

void COLLADABU::URI::parsePath(String *path,String *dir,String *baseName,String *extension)

{
  pcre *ppVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  String *matchString;
  int extResult;
  int extMatches [30];
  int dirResult;
  int dirMatches [30];
  String tmpFile;
  pcre *findExt;
  pcre *findDir;
  char *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  int in_stack_fffffffffffffe6c;
  int *in_stack_fffffffffffffe70;
  string *resultPositions;
  String *in_stack_fffffffffffffe78;
  String *entireString;
  String *in_stack_fffffffffffffe80;
  undefined1 local_158 [124];
  int local_dc;
  undefined1 local_d8 [120];
  string local_60 [32];
  String *local_40;
  pcre *local_38;
  
  if ((parsePath(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&)
       ::findDirCompiledPattern == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parsePath(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&)
                                   ::findDirCompiledPattern), iVar2 != 0)) {
    PcreCompiledPattern::PcreCompiledPattern
              ((PcreCompiledPattern *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
    __cxa_atexit(PcreCompiledPattern::~PcreCompiledPattern,&parsePath::findDirCompiledPattern,
                 &__dso_handle);
    __cxa_guard_release(&parsePath(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&)
                         ::findDirCompiledPattern);
  }
  local_38 = PcreCompiledPattern::getCompiledPattern(&parsePath::findDirCompiledPattern);
  if ((parsePath(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&)
       ::findExtCompiledPattern == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parsePath(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&)
                                   ::findExtCompiledPattern), iVar2 != 0)) {
    PcreCompiledPattern::PcreCompiledPattern
              ((PcreCompiledPattern *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
    __cxa_atexit(PcreCompiledPattern::~PcreCompiledPattern,&parsePath::findExtCompiledPattern,
                 &__dso_handle);
    __cxa_guard_release(&parsePath(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&)
                         ::findExtCompiledPattern);
  }
  local_40 = (String *)PcreCompiledPattern::getCompiledPattern(&parsePath::findExtCompiledPattern);
  std::__cxx11::string::string(local_60);
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  ppVar1 = local_38;
  uVar4 = std::__cxx11::string::c_str();
  uVar3 = std::__cxx11::string::size();
  local_dc = pcre_exec(ppVar1,0,uVar4,uVar3,0,0,local_d8,0x1e);
  if (-1 < local_dc) {
    setStringFromMatches
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe6c);
    setStringFromMatches
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe6c);
    resultPositions = local_60;
    entireString = local_40;
    matchString = (String *)std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::size();
    iVar2 = pcre_exec(entireString,0,matchString,uVar3,0,0,local_158,0x1e);
    if (-1 < iVar2) {
      setStringFromMatches
                (matchString,entireString,(int *)resultPositions,in_stack_fffffffffffffe6c);
      setStringFromMatches
                (matchString,entireString,(int *)resultPositions,in_stack_fffffffffffffe6c);
    }
  }
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void URI::parsePath(const String& path,
		/* out */ String& dir,
		/* out */ String& baseName,
		/* out */ String& extension) {
			// !!!steveT Currently, if we have a file name that begins with a '.', as in
			// ".emacs", that will be treated as having no base name with an extension
			// of ".emacs". We might want to change this behavior, so that the base name
			// is considered ".emacs" and the extension is empty. I think this is more
			// in line with what path parsers in other libraries/languages do, and it
			// more accurately reflects the intended structure of the file name.

			// The following implementation cannot handle paths like this:
			// /tmp/se.3/file

			// regular expression: "(.*/)?(.*)?"
			static const PcreCompiledPattern findDirCompiledPattern("(.*/)?(.*)?");

			pcre* findDir = findDirCompiledPattern.getCompiledPattern();


			// regular expression: "([^.]*)?(\.(.*))?"
			static const PcreCompiledPattern findExtCompiledPattern("([^.]*)?(\\.(.*))?");
			pcre* findExt = findExtCompiledPattern.getCompiledPattern();
			
			String tmpFile;
			dir.clear();
			baseName.clear();
			extension.clear();

			int dirMatches[regExpMatchesVectorLength];

			int  dirResult = pcre_exec(
										findDir,           /* the compiled pattern */
										0,                 /* no extra data - we didn't study the pattern */
										path.c_str(),      /* the subject string */
										(int)path.size(),  /* the length of the subject */
										0,                 /* start at offset 0 in the subject */
										0,                 /* default options */
										dirMatches,     /* output vector for substring information */
										regExpMatchesVectorLength); /* number of elements in the output vector */

			if ( dirResult >= 0 )
			{	
				setStringFromMatches(dir, path, dirMatches, 1);
				setStringFromMatches(tmpFile, path, dirMatches, 2);

				int extMatches[regExpMatchesVectorLength];

				int  extResult = pcre_exec(
											findExt,           /* the compiled pattern */
											0,                 /* no extra data - we didn't study the pattern */
											tmpFile.c_str(),      /* the subject string */
											(int)tmpFile.size(),  /* the length of the subject */
											0,                 /* start at offset 0 in the subject */
											0,                 /* default options */
											extMatches,     /* output vector for substring information */
											regExpMatchesVectorLength); /* number of elements in the output vector */

				
				if ( extResult >= 0 )
				{
					setStringFromMatches(baseName, tmpFile, extMatches, 1);
					setStringFromMatches(extension, tmpFile, extMatches, 3);
				}
			}
	}